

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

String * __thiscall asl::String::replaceme(String *this,char a,char b)

{
  char cVar1;
  anon_union_16_2_78e7fdac_for_String_2 *paVar2;
  
  if (this->_size == 0) {
    paVar2 = &this->field_2;
  }
  else {
    paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  do {
    if (paVar2->_space[0] == a) {
      paVar2->_space[0] = b;
    }
    cVar1 = paVar2->_space[0];
    paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)((long)paVar2 + 1);
  } while (cVar1 != '\0');
  return this;
}

Assistant:

String& String::replaceme(char a, char b)
{
	char* p = str();
	do {
		if(*p == a)
			*p = b;
	}
	while(*p++);
	return *this;
}